

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

void pfd_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  PlugVtable *pPVar1;
  
  pPVar1 = plug[-8].vt;
  if (type == PLUGCLOSE_NORMAL) {
    if (pPVar1 != (PlugVtable *)0x0) {
      (**(code **)(pPVar1->log + 8))();
      return;
    }
    return;
  }
  if (pPVar1 != (PlugVtable *)0x0) {
    (**(code **)(pPVar1->log + 0x10))(pPVar1,error_msg);
    return;
  }
  pfd_close((PortForwarding *)(plug + -8));
  return;
}

Assistant:

static void pfd_closing(Plug *plug, PlugCloseType type, const char *error_msg)
{
    struct PortForwarding *pf =
        container_of(plug, struct PortForwarding, plug);

    if (type != PLUGCLOSE_NORMAL) {
        /*
         * Socket error. Slam the connection instantly shut.
         */
        if (pf->c) {
            sshfwd_initiate_close(pf->c, error_msg);
        } else {
            /*
             * We might not have an SSH channel, if a socket error
             * occurred during SOCKS negotiation. If not, we must
             * clean ourself up without sshfwd_initiate_close's call
             * back to pfd_close.
             */
            pfd_close(pf);
        }
    } else {
        /*
         * Ordinary EOF received on socket. Send an EOF on the SSH
         * channel.
         */
        if (pf->c)
            sshfwd_write_eof(pf->c);
    }
}